

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  element_type *peVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined8 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_10;
  undefined1 auVar53 [64];
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmzz2;
  double Jmyy2;
  double mass_phi2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmzz1;
  double Jmyy1;
  double mass_phi1;
  DampingCoefficients rdamping_coeff2;
  DampingCoefficients rdamping_coeff1;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined1 local_108 [64];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [64];
  double local_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  ulong local_40;
  double local_38;
  double dStack_30;
  double dStack_28;
  double dStack_20;
  ulong local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if (this->compute_ave_sec_par == false) {
    uVar20 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x58))();
    dVar21 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x178))();
    dVar22 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    dVar23 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar24 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar25 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar26 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar27 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    dVar28 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x20))();
    dVar29 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    dVar30 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    dVar31 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    local_108._0_8_ =
         (**(code **)((long)(((this->sectionA).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x30))();
    local_108._8_8_ = extraout_XMM0_Qb_00;
    uVar32 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x38))();
    uVar33 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x40))();
    uVar34 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x48))();
    auVar53._0_8_ =
         (**(code **)((long)(((this->sectionA).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x50))();
    auVar53._8_56_ = extraout_var;
    auVar3._8_8_ = extraout_XMM0_Qb;
    auVar3._0_8_ = uVar20;
    auVar8._8_8_ = extraout_XMM0_Qb_01;
    auVar8._0_8_ = uVar32;
    auVar9._8_8_ = extraout_XMM0_Qb_03;
    auVar9._0_8_ = uVar34;
    peVar1 = (this->sectionA).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar2 = vunpcklpd_avx(auVar3,local_108._0_16_);
    auVar10._8_8_ = extraout_XMM0_Qb_02;
    auVar10._0_8_ = uVar33;
    auVar3 = vunpcklpd_avx(auVar8,auVar10);
    auVar18 = vmovlhps_avx(auVar9,auVar53._0_16_);
    auVar19 = vinsertf32x4_avx512f(ZEXT3264(CONCAT1616(auVar3,auVar2)),auVar18,2);
    auVar18._0_8_ =
         (peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
         super_ChBeamSectionEulerAdvancedGeneric.Byy;
    auVar18._8_8_ =
         (peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
         super_ChBeamSectionEulerAdvancedGeneric.Bzz;
    local_108 = vinsertf32x4_avx512f(auVar19,auVar18,3);
    (**(code **)((long)(peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar1,&local_118,&local_120,&local_128,&local_110,&local_130,&local_138);
    dVar35 = cos(local_110);
    dVar36 = sin(local_110);
    (**(code **)((long)(((this->sectionA).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_38);
    local_b8 = (**(code **)((long)(((this->sectionA).
                                    super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                  super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                  super_ChBeamSection._vptr_ChBeamSection + 0x1a8))();
    uStack_b0 = extraout_XMM0_Qb_04;
    uVar20 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x58))();
    dVar37 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x178))();
    dVar38 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    dVar39 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar40 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar41 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar42 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar43 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    dVar44 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x20))();
    dVar45 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    dVar46 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    dVar47 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    uVar32 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x30))();
    uVar33 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x38))();
    local_a8._0_8_ =
         (**(code **)((long)(((this->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x40))();
    local_a8._8_8_ = extraout_XMM0_Qb_08;
    local_c8 = (**(code **)((long)(((this->sectionB).
                                    super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                  super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                  super_ChBeamSection._vptr_ChBeamSection + 0x48))();
    uStack_c0 = extraout_XMM0_Qb_09;
    auVar54._0_8_ =
         (**(code **)((long)(((this->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x50))();
    auVar54._8_56_ = extraout_var_00;
    auVar11._8_8_ = extraout_XMM0_Qb_05;
    auVar11._0_8_ = uVar20;
    auVar12._8_8_ = extraout_XMM0_Qb_07;
    auVar12._0_8_ = uVar33;
    auVar15._8_8_ = uStack_c0;
    auVar15._0_8_ = local_c8;
    peVar1 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar13._8_8_ = extraout_XMM0_Qb_06;
    auVar13._0_8_ = uVar32;
    auVar18 = vunpcklpd_avx(auVar11,auVar13);
    auVar2 = vunpcklpd_avx(auVar12,local_a8._0_16_);
    auVar3 = vunpcklpd_avx(auVar15,auVar54._0_16_);
    auVar19 = vinsertf32x4_avx512f(ZEXT3264(CONCAT1616(auVar2,auVar18)),auVar3,2);
    auVar2._0_8_ = (peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
                   super_ChBeamSectionEulerAdvancedGeneric.Byy;
    auVar2._8_8_ = (peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
                   super_ChBeamSectionEulerAdvancedGeneric.Bzz;
    auVar19 = vinsertf32x4_avx512f(auVar19,auVar2,3);
    local_a8 = vaddpd_avx512f(auVar19,local_108);
    (**(code **)((long)(peVar1->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar1,&local_148,&local_150,&local_158,&local_140,&local_160,&local_168);
    dVar48 = cos(local_140);
    dVar49 = sin(local_140);
    local_108._0_8_ = dVar49;
    (**(code **)((long)(((this->sectionB).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_60);
    uVar20 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x1a8))();
    dVar49 = this->length;
    peVar17 = (this->avg_sec_par).
              super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar19._8_8_ = 0x3fe0000000000000;
    auVar19._0_8_ = 0x3fe0000000000000;
    auVar19._16_8_ = 0x3fe0000000000000;
    auVar19._24_8_ = 0x3fe0000000000000;
    auVar19._32_8_ = 0x3fe0000000000000;
    auVar19._40_8_ = 0x3fe0000000000000;
    auVar19._48_8_ = 0x3fe0000000000000;
    auVar19._56_8_ = 0x3fe0000000000000;
    auVar19 = vmulpd_avx512f(local_a8,auVar19);
    peVar17->mu = (double)auVar19._0_8_;
    peVar17->alpha = (double)auVar19._8_8_;
    peVar17->Cy = (double)auVar19._16_8_;
    peVar17->Cz = (double)auVar19._24_8_;
    peVar17->Sy = (double)auVar19._32_8_;
    peVar17->Sz = (double)auVar19._40_8_;
    peVar17->My = (double)auVar19._48_8_;
    peVar17->Mz = (double)auVar19._56_8_;
    if (0.0 <= dVar21 * dVar37) {
      local_a8._0_8_ = dVar21 * dVar37;
      dVar52 = pow(dVar21 * dVar21 * dVar21 * dVar37,0.25);
      dVar50 = pow((double)local_a8._0_8_,0.5);
      dVar51 = pow(dVar37 * dVar37 * (double)local_a8._0_8_,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar51 + dVar50 + dVar52 + dVar21 + dVar37) / 5.0;
    }
    else {
      dVar21 = (dVar21 + dVar37) * 0.5;
    }
    peVar17->Jyy = dVar21;
    dVar21 = dVar22 * dVar38;
    if (0.0 <= dVar21) {
      dVar37 = pow(dVar22 * dVar22 * dVar22 * dVar38,0.25);
      dVar52 = pow(dVar21,0.5);
      dVar21 = pow(dVar38 * dVar38 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar52 + dVar37 + dVar22 + dVar38) / 5.0;
    }
    else {
      dVar21 = (dVar22 + dVar38) * 0.5;
    }
    peVar17->Jzz = dVar21;
    dVar22 = dVar23 * dVar39;
    if (0.0 <= dVar22) {
      dVar21 = pow(dVar23 * dVar23 * dVar23 * dVar39,0.25);
      dVar37 = pow(dVar22,0.5);
      dVar22 = pow(dVar39 * dVar39 * dVar22,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + dVar37 + dVar21 + dVar23 + dVar39) / 5.0;
      dVar21 = peVar17->Jzz;
    }
    else {
      dVar22 = (dVar23 + dVar39) * 0.5;
    }
    peVar17->Jyz = dVar22;
    peVar17->Jxx = dVar21 + peVar17->Jyy;
    if (0.0 <= dVar24 * dVar40) {
      dVar21 = pow(dVar24 * dVar40,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar24 + dVar40) / 3.0;
    }
    else {
      dVar21 = (dVar24 + dVar40) * 0.5;
    }
    peVar17->Qy = dVar21;
    if (0.0 <= dVar25 * dVar41) {
      dVar21 = pow(dVar25 * dVar41,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar25 + dVar41) / 3.0;
    }
    else {
      dVar21 = (dVar25 + dVar41) * 0.5;
    }
    peVar17->Qz = dVar21;
    peVar17->mass_phi = (local_110 + local_140) * 0.5;
    dVar21 = local_118 * local_148;
    if (0.0 <= dVar21) {
      dVar22 = pow(local_148 * local_118 * local_118 * local_118,0.25);
      dVar23 = pow(dVar21,0.5);
      dVar21 = pow(local_148 * local_148 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar23 + dVar22 + local_118 + local_148) / 5.0;
    }
    else {
      dVar21 = (local_118 + local_148) * 0.5;
    }
    peVar17->Jmyy = dVar21;
    dVar21 = local_120 * local_150;
    if (0.0 <= dVar21) {
      dVar22 = pow(local_150 * local_120 * local_120 * local_120,0.25);
      dVar23 = pow(dVar21,0.5);
      dVar21 = pow(local_150 * local_150 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar23 + dVar22 + local_120 + local_150) / 5.0;
    }
    else {
      dVar21 = (local_120 + local_150) * 0.5;
    }
    peVar17->Jmzz = dVar21;
    dVar22 = local_128 * local_158;
    if (0.0 <= dVar22) {
      dVar21 = pow(local_158 * local_128 * local_128 * local_128,0.25);
      dVar23 = pow(dVar22,0.5);
      dVar22 = pow(local_158 * local_158 * dVar22,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + dVar23 + dVar21 + local_128 + local_158) / 5.0;
      dVar21 = peVar17->Jmzz;
    }
    else {
      dVar22 = (local_128 + local_158) * 0.5;
    }
    peVar17->Jmyz = dVar22;
    peVar17->Jmxx = dVar21 + peVar17->Jmyy;
    if (0.0 <= local_130 * local_160) {
      dVar21 = pow(local_130 * local_160,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + local_130 + local_160) / 3.0;
    }
    else {
      dVar21 = (local_130 + local_160) * 0.5;
    }
    peVar17->Qmy = dVar21;
    if (0.0 <= local_138 * local_168) {
      dVar21 = pow(local_138 * local_168,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + local_138 + local_168) / 3.0;
    }
    else {
      dVar21 = (local_138 + local_168) * 0.5;
    }
    peVar17->Qmz = dVar21;
    if (0.0 <= dVar26 * dVar42) {
      dVar21 = pow(dVar26 * dVar42,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar26 + dVar42) / 3.0;
    }
    else {
      dVar21 = (dVar26 + dVar42) * 0.5;
    }
    peVar17->EA = dVar21;
    if (0.0 <= dVar27 * dVar43) {
      dVar21 = pow(dVar27 * dVar43,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar27 + dVar43) / 3.0;
    }
    else {
      dVar21 = (dVar27 + dVar43) * 0.5;
    }
    peVar17->GJ = dVar21;
    dVar21 = dVar30 * dVar46;
    if (0.0 <= dVar21) {
      dVar22 = pow(dVar30 * dVar30 * dVar30 * dVar46,0.25);
      dVar23 = pow(dVar21,0.5);
      dVar21 = pow(dVar21 * dVar46 * dVar46,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar23 + dVar22 + dVar30 + dVar46) / 5.0;
    }
    else {
      dVar21 = (dVar30 + dVar46) * 0.5;
    }
    peVar17->GAyy = dVar21;
    dVar21 = dVar31 * dVar47;
    if (0.0 <= dVar21) {
      dVar22 = pow(dVar31 * dVar31 * dVar31 * dVar47,0.25);
      dVar23 = pow(dVar21,0.5);
      dVar21 = pow(dVar21 * dVar47 * dVar47,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar47 + dVar21 + dVar23 + dVar22 + dVar31) / 5.0;
    }
    else {
      dVar21 = (dVar31 + dVar47) * 0.5;
    }
    dVar22 = dVar47 * (double)local_108._0_8_;
    peVar17->GAzz = dVar21;
    dVar21 = dVar28 * dVar44;
    if (0.0 <= dVar21) {
      dVar23 = pow(dVar28 * dVar28 * dVar28 * dVar44,0.25);
      dVar24 = pow(dVar21,0.5);
      dVar21 = pow(dVar44 * dVar44 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar24 + dVar23 + dVar28 + dVar44) / 5.0;
    }
    else {
      dVar21 = (dVar28 + dVar44) * 0.5;
    }
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar22;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar31 * dVar36;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar35;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar46;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar30;
    peVar17->EIyy = dVar21;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar48;
    auVar18 = vfmadd231sd_fma(auVar83,auVar62,auVar55);
    dVar23 = auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar80,auVar74,auVar70);
    dVar21 = dVar29 * dVar45;
    dVar22 = auVar18._0_8_;
    if (0.0 <= dVar21) {
      dVar24 = pow(dVar29 * dVar29 * dVar29 * dVar45,0.25);
      dVar25 = pow(dVar21,0.5);
      dVar21 = pow(dVar21 * dVar45 * dVar45,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar45 + dVar21 + dVar25 + dVar24 + dVar29) / 5.0;
    }
    else {
      dVar21 = (dVar29 + dVar45) * 0.5;
    }
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar46;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar30;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar31 * dVar35;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_108._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar36;
    peVar17->EIzz = dVar21;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar47 * dVar48;
    auVar18 = vfnmadd213sd_fma(auVar75,auVar71,auVar77);
    dVar21 = dVar45 * (double)local_108._0_8_;
    dVar24 = dVar23 * dVar22;
    auVar2 = vfnmadd213sd_fma(auVar63,auVar56,auVar84);
    dVar25 = auVar2._0_8_;
    dVar26 = auVar18._0_8_;
    if (0.0 <= dVar24) {
      dVar27 = pow(dVar22 * dVar23 * dVar23 * dVar23,0.25);
      dVar30 = pow(dVar24,0.5);
      dVar24 = pow(dVar22 * dVar22 * dVar24,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar24 + dVar30 + dVar27 + dVar23 + dVar22) / 5.0;
    }
    else {
      dVar22 = (dVar23 + dVar22) * 0.5;
    }
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar21;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar29 * dVar36;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar35;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar28;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar48;
    peVar17->GAmyy = dVar22;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar44;
    auVar18 = vfmadd231sd_fma(auVar82,auVar57,auVar72);
    dVar21 = dVar25 * dVar26;
    dVar23 = auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar79,auVar68,auVar78);
    dVar22 = auVar18._0_8_;
    if (0.0 <= dVar21) {
      dVar24 = pow(dVar25 * dVar25 * dVar25 * dVar26,0.25);
      dVar27 = pow(dVar21,0.5);
      dVar21 = pow(dVar26 * dVar26 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar27 + dVar24 + dVar25 + dVar26) / 5.0;
    }
    else {
      dVar21 = (dVar25 + dVar26) * 0.5;
    }
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar44;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar28;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar45 * dVar48;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar29 * dVar35;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar36;
    peVar17->GAmzz = dVar21;
    auVar18 = vfnmadd213sd_fma(auVar64,auVar58,auVar81);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_108._0_8_;
    dVar24 = auVar18._0_8_;
    auVar18 = vfnmadd213sd_fma(auVar65,auVar69,auVar76);
    dVar21 = dVar23 * dVar22;
    local_108._0_8_ = auVar18._0_8_;
    if (0.0 <= dVar21) {
      dVar25 = pow(dVar22 * dVar23 * dVar23 * dVar23,0.25);
      dVar26 = pow(dVar21,0.5);
      dVar21 = pow(dVar22 * dVar22 * dVar21,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar21 + dVar26 + dVar25 + dVar23 + dVar22) / 5.0;
      dVar22 = (double)local_108._0_8_;
    }
    else {
      dVar21 = (dVar23 + dVar22) * 0.5;
      dVar22 = auVar18._0_8_;
    }
    dVar23 = dVar24 * dVar22;
    peVar17->EImyy = dVar21;
    if (0.0 <= dVar23) {
      dVar21 = pow(dVar24 * dVar24 * dVar24 * dVar22,0.25);
      dVar22 = pow(dVar23,0.5);
      dVar23 = pow((double)local_108._0_8_ * (double)local_108._0_8_ * dVar23,0.25);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar21 = (dVar23 + dVar22 + dVar21 + dVar24 + (double)local_108._0_8_) / 5.0;
    }
    else {
      dVar21 = (dVar24 + dVar22) * 0.5;
    }
    peVar17->EImzz = dVar21;
    dVar49 = dVar49 * dVar49;
    (peVar17->rdamping_coeff).bx = (local_38 + local_60) * 0.5;
    (peVar17->rdamping_coeff).by = (dStack_30 + dStack_58) * 0.5;
    (peVar17->rdamping_coeff).bz = (dStack_28 + dStack_50) * 0.5;
    (peVar17->rdamping_coeff).bt = (dStack_20 + dStack_48) * 0.5;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_18;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_40;
    auVar16._8_8_ = uStack_b0;
    auVar16._0_8_ = local_b8;
    auVar18 = vunpcklpd_avx(auVar66,auVar16);
    auVar14._8_8_ = extraout_XMM0_Qb_10;
    auVar14._0_8_ = uVar20;
    auVar2 = vunpcklpd_avx(auVar73,auVar14);
    (peVar17->rdamping_coeff).alpha = (auVar18._0_8_ + auVar2._0_8_) * 0.5;
    peVar17->artificial_factor_for_shear_damping = (auVar18._8_8_ + auVar2._8_8_) * 0.5;
    peVar17->phimy = 0.0;
    peVar17->phimz = 0.0;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = peVar17->GAmyy;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar67,auVar4);
    if (0.01 < auVar18._0_8_) {
      peVar17->phimy = (dVar21 * 12.0) / (dVar49 * peVar17->GAmyy);
    }
    auVar59._8_8_ = 0;
    auVar59._0_8_ = peVar17->GAmzz;
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar59,auVar5);
    if (0.01 < auVar18._0_8_) {
      peVar17->phimz = (peVar17->EImyy * 12.0) / (dVar49 * peVar17->GAmzz);
    }
    peVar17->phiy = 0.0;
    peVar17->phiz = 0.0;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = peVar17->GAyy;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar60,auVar6);
    if (0.01 < auVar18._0_8_) {
      peVar17->phiy = (peVar17->EIzz * 12.0) / (dVar49 * peVar17->GAyy);
    }
    auVar61._8_8_ = 0;
    auVar61._0_8_ = peVar17->GAzz;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar61,auVar7);
    if (0.01 < auVar18._0_8_) {
      peVar17->phiz = (peVar17->EIyy * 12.0) / (dVar49 * peVar17->GAzz);
    }
    this->compute_ave_sec_par = true;
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters() {
    if (compute_ave_sec_par) {
        return;
    }

    double mu1 = this->sectionA->GetMassPerUnitLength();
    // double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();
    // double Jmxx1 = this->sectionA->GetInertiaJxxPerUnitLengthInMassReference();
    double EA1 = this->sectionA->GetAxialRigidity();
    double GJ1 = this->sectionA->GetXtorsionRigidity();
    double EIyy1 = this->sectionA->GetYbendingRigidity();
    double EIzz1 = this->sectionA->GetZbendingRigidity();
    double GAyy1 = this->sectionA->GetYshearRigidity();
    double GAzz1 = this->sectionA->GetZshearRigidity();
    double alpha1 = this->sectionA->GetSectionRotation();
    double Cy1 = this->sectionA->GetCentroidY();
    double Cz1 = this->sectionA->GetCentroidZ();
    double Sy1 = this->sectionA->GetShearCenterY();
    double Sz1 = this->sectionA->GetShearCenterZ();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmyy1;
    double Jmzz1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    // double Jmxx1 = Jmyy1 + Jmzz1;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi1 = cos(mass_phi1);
    double sinphi1 = sin(mass_phi1);
    double EImyy1 = EIyy1 * cosphi1 + EIzz1 * sinphi1;
    double EImzz1 = -EIyy1 * sinphi1 + EIzz1 * cosphi1;
    double GAmyy1 = GAyy1 * cosphi1 + GAzz1 * sinphi1;
    double GAmzz1 = -GAyy1 * sinphi1 + GAzz1 * cosphi1;
    DampingCoefficients rdamping_coeff1 = this->sectionA->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping1 = this->sectionA->GetArtificialFactorForShearDamping();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    // double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();
    // double Jmxx2 = this->sectionB->GetInertiaJxxPerUnitLengthInMassReference();
    double EA2 = this->sectionB->GetAxialRigidity();
    double GJ2 = this->sectionB->GetXtorsionRigidity();
    double EIyy2 = this->sectionB->GetYbendingRigidity();
    double EIzz2 = this->sectionB->GetZbendingRigidity();
    double GAyy2 = this->sectionB->GetYshearRigidity();
    double GAzz2 = this->sectionB->GetZshearRigidity();
    double alpha2 = this->sectionB->GetSectionRotation();
    double Cy2 = this->sectionB->GetCentroidY();
    double Cz2 = this->sectionB->GetCentroidZ();
    double Sy2 = this->sectionB->GetShearCenterY();
    double Sz2 = this->sectionB->GetShearCenterZ();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmyy2;
    double Jmzz2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    // double Jmxx2 = Jmyy2 + Jmzz2;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi2 = cos(mass_phi2);
    double sinphi2 = sin(mass_phi2);
    double EImyy2 = EIyy2 * cosphi2 + EIzz2 * sinphi2;
    double EImzz2 = -EIyy2 * sinphi2 + EIzz2 * cosphi2;
    double GAmyy2 = GAyy2 * cosphi2 + GAzz2 * sinphi2;
    double GAmzz2 = -GAyy2 * sinphi2 + GAzz2 * cosphi2;
    DampingCoefficients rdamping_coeff2 = this->sectionB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping2 = this->sectionB->GetArtificialFactorForShearDamping();

    double L = this->GetLength();
    double LL = L * L;

    this->avg_sec_par->mu = GetAverageValue(mu1, mu2);
    this->avg_sec_par->alpha = GetAverageValue(alpha1, alpha2);
    this->avg_sec_par->Cy = GetAverageValue(Cy1, Cy2);
    this->avg_sec_par->Cz = GetAverageValue(Cz1, Cz2);
    this->avg_sec_par->Sy = GetAverageValue(Sy1, Sy2);
    this->avg_sec_par->Sz = GetAverageValue(Sz1, Sz2);
    this->avg_sec_par->My = GetAverageValue(My1, My2);
    this->avg_sec_par->Mz = GetAverageValue(Mz1, Mz2);

    this->avg_sec_par->Jyy = GetAverageValue5(Jyy1, Jyy2);
    this->avg_sec_par->Jzz = GetAverageValue5(Jzz1, Jzz2);
    this->avg_sec_par->Jyz = GetAverageValue5(Jyz1, Jyz2);  // Jyz may be negative
    this->avg_sec_par->Jxx = this->avg_sec_par->Jyy + this->avg_sec_par->Jzz;
    this->avg_sec_par->Qy = GetAverageValue3(Qy1, Qy2);  // Qy may be negative
    this->avg_sec_par->Qz = GetAverageValue3(Qz1, Qz2);  // Qz may be negative

    this->avg_sec_par->mass_phi = GetAverageValue(mass_phi1, mass_phi2);
    this->avg_sec_par->Jmyy = GetAverageValue5(Jmyy1, Jmyy2);
    this->avg_sec_par->Jmzz = GetAverageValue5(Jmzz1, Jmzz2);
    this->avg_sec_par->Jmyz = GetAverageValue5(Jmyz1, Jmyz2);  // Jyz may be negative
    this->avg_sec_par->Jmxx = this->avg_sec_par->Jmyy + this->avg_sec_par->Jmzz;
    this->avg_sec_par->Qmy = GetAverageValue3(Qmy1, Qmy2);  // Qy may be negative
    this->avg_sec_par->Qmz = GetAverageValue3(Qmz1, Qmz2);  // Qz may be negative

    this->avg_sec_par->EA = GetAverageValue3(EA1, EA2);
    this->avg_sec_par->GJ = GetAverageValue3(GJ1, GJ2);
    this->avg_sec_par->GAyy = GetAverageValue5(GAyy1, GAyy2);
    this->avg_sec_par->GAzz = GetAverageValue5(GAzz1, GAzz2);
    this->avg_sec_par->EIyy = GetAverageValue5(EIyy1, EIyy2);
    this->avg_sec_par->EIzz = GetAverageValue5(EIzz1, EIzz2);

    this->avg_sec_par->GAmyy = GetAverageValue5(GAmyy1, GAmyy2);
    this->avg_sec_par->GAmzz = GetAverageValue5(GAmzz1, GAmzz2);
    this->avg_sec_par->EImyy = GetAverageValue5(EImyy1, EImyy2);
    this->avg_sec_par->EImzz = GetAverageValue5(EImzz1, EImzz2);

    this->avg_sec_par->rdamping_coeff.bx = GetAverageValue(rdamping_coeff1.bx, rdamping_coeff2.bx);
    this->avg_sec_par->rdamping_coeff.by = GetAverageValue(rdamping_coeff1.by, rdamping_coeff2.by);
    this->avg_sec_par->rdamping_coeff.bz = GetAverageValue(rdamping_coeff1.bz, rdamping_coeff2.bz);
    this->avg_sec_par->rdamping_coeff.bt = GetAverageValue(rdamping_coeff1.bt, rdamping_coeff2.bt);
    this->avg_sec_par->rdamping_coeff.alpha = GetAverageValue(rdamping_coeff1.alpha, rdamping_coeff2.alpha);
    this->avg_sec_par->artificial_factor_for_shear_damping =
        GetAverageValue(artificial_factor_for_shear_damping1, artificial_factor_for_shear_damping2);

    this->avg_sec_par->phimy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phimz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    double eps = 0.01;
    if (abs(this->avg_sec_par->GAmyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimy = 12.0 * this->avg_sec_par->EImzz / (this->avg_sec_par->GAmyy * LL);
    }
    if (abs(this->avg_sec_par->GAmzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimz = 12.0 * this->avg_sec_par->EImyy / (this->avg_sec_par->GAmzz * LL);
    }

    this->avg_sec_par->phiy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phiz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    if (abs(this->avg_sec_par->GAyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiy = 12.0 * this->avg_sec_par->EIzz / (this->avg_sec_par->GAyy * LL);
    }
    if (abs(this->avg_sec_par->GAzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiz = 12.0 * this->avg_sec_par->EIyy / (this->avg_sec_par->GAzz * LL);
    }
    
    // update the status of lock, to avoid computing again.
    compute_ave_sec_par = true;
}